

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qparallelanimationgroup.cpp
# Opt level: O3

void __thiscall
QParallelAnimationGroup::updateDirection(QParallelAnimationGroup *this,Direction direction)

{
  QUntypedPropertyData *data;
  long lVar1;
  long lVar2;
  State SVar3;
  int iVar4;
  undefined4 uVar5;
  long lVar6;
  
  lVar1 = *(long *)(this + 8);
  SVar3 = QAbstractAnimation::state((QAbstractAnimation *)this);
  if (SVar3 == Stopped) {
    if (direction == Forward) {
      *(undefined4 *)(lVar1 + 0xc0) = 0;
      uVar5 = 0;
    }
    else {
      data = (QUntypedPropertyData *)(lVar1 + 0x88);
      if ((*(long **)(lVar1 + 0x48) != (long *)0x0) && (**(long **)(lVar1 + 0x48) != 0)) {
        QBindingStorage::registerDependency_helper((QBindingStorage *)(lVar1 + 0x40),data);
      }
      iVar4 = *(int *)data;
      if (iVar4 == -1) {
        iVar4 = 0;
      }
      else {
        if ((*(long **)(lVar1 + 0x48) != (long *)0x0) && (**(long **)(lVar1 + 0x48) != 0)) {
          QBindingStorage::registerDependency_helper((QBindingStorage *)(lVar1 + 0x40),data);
          iVar4 = *(int *)data;
        }
        iVar4 = iVar4 + -1;
      }
      *(int *)(lVar1 + 0xc0) = iVar4;
      uVar5 = (**(code **)(*(long *)this + 0x60))(this);
    }
    *(undefined4 *)(lVar1 + 0xc4) = uVar5;
  }
  else {
    lVar2 = *(long *)(lVar1 + 0xb0);
    if (lVar2 != 0) {
      lVar1 = *(long *)(lVar1 + 0xa8);
      lVar6 = 0;
      do {
        QAbstractAnimation::setDirection(*(QAbstractAnimation **)(lVar1 + lVar6),direction);
        lVar6 = lVar6 + 8;
      } while (lVar2 << 3 != lVar6);
    }
  }
  return;
}

Assistant:

void QParallelAnimationGroup::updateDirection(QAbstractAnimation::Direction direction)
{
    Q_D(QParallelAnimationGroup);
    //we need to update the direction of the current animation
    if (state() != Stopped) {
        for (AnimationListConstIt it = d->animations.constBegin(), cend = d->animations.constEnd(); it != cend; ++it)
            (*it)->setDirection(direction);
    } else {
        if (direction == Forward) {
            d->lastLoop = 0;
            d->lastCurrentTime = 0;
        } else {
            // Looping backwards with loopCount == -1 does not really work well...
            d->lastLoop = (d->loopCount == -1 ? 0 : d->loopCount - 1);
            d->lastCurrentTime = duration();
        }
    }
}